

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::handleFunctionEntry
          (TGlslangToSpvTraverser *this,TIntermAggregate *node)

{
  int iVar1;
  undefined4 extraout_var;
  char *__s;
  mapped_type *ppFVar2;
  Block *bp;
  Block *functionBlock;
  key_type local_38;
  TIntermAggregate *local_18;
  TIntermAggregate *node_local;
  TGlslangToSpvTraverser *this_local;
  
  local_18 = node;
  node_local = (TIntermAggregate *)this;
  iVar1 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x35])();
  __s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              CONCAT44(extraout_var,iVar1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,__s,(allocator<char> *)((long)&functionBlock + 7));
  ppFVar2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>_>_>
            ::operator[](&this->functionMap,&local_38);
  this->currentFunction = *ppFVar2;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)((long)&functionBlock + 7));
  bp = spv::Function::getEntryBlock(this->currentFunction);
  spv::Builder::setBuildPoint(&this->builder,bp);
  spv::Builder::enterFunction(&this->builder,this->currentFunction);
  return;
}

Assistant:

void TGlslangToSpvTraverser::handleFunctionEntry(const glslang::TIntermAggregate* node)
{
    // SPIR-V functions should already be in the functionMap from the prepass
    // that called makeFunctions().
    currentFunction = functionMap[node->getName().c_str()];
    spv::Block* functionBlock = currentFunction->getEntryBlock();
    builder.setBuildPoint(functionBlock);
    builder.enterFunction(currentFunction);
}